

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_endian.c
# Opt level: O2

void test_convert_htole64(void)

{
  uint64_t check;
  uint64_t check_pattern;
  
  check_pattern = 0xf0debc9a78563412;
  check = cio_htole64(0xf0debc9a78563412);
  UnityAssertEqualMemory
            (&check_pattern,&check,8,1,"64 bit little endian conversion incorrect!",0xb3,
             UNITY_ARRAY_TO_ARRAY);
  return;
}

Assistant:

static void test_convert_htole64(void)
{
	uint8_t pattern_array[] = {0x12, 0x34, 0x56, 0x78, 0x9a, 0xbc, 0xde, 0xf0};
	uint64_t pattern;
	memcpy(&pattern, pattern_array, sizeof(pattern));
	uint64_t check_pattern = 0xf0debc9a78563412;

	uint64_t check = cio_htole64(pattern);

	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(&check_pattern, &check, sizeof(check), "64 bit little endian conversion incorrect!");
}